

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::BlitColorConversionCase::compare
          (BlitColorConversionCase *this,Surface *reference,Surface *result)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  RGBA RVar3;
  int iVar4;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  TextureFormat dstFormat;
  TextureFormat srcFormat;
  RGBA local_1cc;
  TextureFormat local_1c8;
  TextureFormat local_1c0;
  Surface *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c0 = glu::mapGLInternalFormat(this->m_srcFormat);
  local_1c8 = glu::mapGLInternalFormat(this->m_dstFormat);
  bVar1 = tcu::isSRGB(local_1c0);
  bVar2 = tcu::isSRGB(local_1c8);
  local_1cc.m_value = 0;
  if (bVar2) {
    local_1cc = FboTestUtil::getToSRGBConversionThreshold(&local_1c0,&local_1c8);
  }
  else {
    RVar3 = FboTestUtil::getFormatThreshold(&local_1c0);
    uVar12 = (RVar3.m_value & 0xff) << bVar1;
    if (0xfe < (int)uVar12) {
      uVar12 = 0xff;
    }
    iVar4 = (RVar3.m_value >> 8 & 0xff) << bVar1;
    if (0xfe < iVar4) {
      iVar4 = 0xff;
    }
    iVar7 = (RVar3.m_value >> 0x10 & 0xff) << bVar1;
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    iVar9 = (RVar3.m_value >> 0x18) << bVar1;
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    uVar10 = iVar9 << 0x18 | uVar12 | iVar7 << 0x10 | iVar4 << 8;
    local_1b8 = reference;
    RVar3 = FboTestUtil::getFormatThreshold(&local_1c8);
    uVar8 = RVar3.m_value & 0xff;
    if ((int)(RVar3.m_value & 0xff) < (int)uVar12) {
      uVar8 = uVar12;
    }
    uVar6 = uVar10 >> 8 & 0xff;
    uVar12 = RVar3.m_value >> 8 & 0xff;
    if (uVar12 < uVar6) {
      uVar12 = uVar6;
    }
    uVar11 = uVar10 >> 0x10 & 0xff;
    uVar6 = RVar3.m_value >> 0x10 & 0xff;
    if (uVar6 < uVar11) {
      uVar6 = uVar11;
    }
    uVar11 = RVar3.m_value >> 0x18;
    if (RVar3.m_value >> 0x18 < uVar10 >> 0x18) {
      uVar11 = uVar10 >> 0x18;
    }
    local_1cc.m_value = uVar6 << 0x10 | uVar12 << 8 | uVar8 | uVar11 << 0x18;
    reference = local_1b8;
  }
  local_1b0._0_8_ =
       ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"threshold = ",0xc);
  RVar3.m_value = local_1cc.m_value;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
  poVar5 = (ostream *)std::ostream::operator<<(this_00,RVar3.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar3.m_value >> 8 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar3.m_value >> 0x10 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar3.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  bVar1 = tcu::pixelThresholdCompare
                    (((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,"Result","Image comparison result",reference,result,
                     &local_1cc,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::TextureFormat	srcFormat	= glu::mapGLInternalFormat(m_srcFormat);
		const tcu::TextureFormat	dstFormat	= glu::mapGLInternalFormat(m_dstFormat);
		const bool					srcIsSRGB	= tcu::isSRGB(srcFormat);
		const bool					dstIsSRGB	= tcu::isSRGB(dstFormat);

		tcu::RGBA					threshold;

		if (dstIsSRGB)
		{
			threshold = getToSRGBConversionThreshold(srcFormat, dstFormat);
		}
		else
		{
			const tcu::RGBA	srcMaxDiff	= getFormatThreshold(srcFormat) * (srcIsSRGB ? 2 : 1);
			const tcu::RGBA	dstMaxDiff	= getFormatThreshold(dstFormat);

			threshold = tcu::max(srcMaxDiff, dstMaxDiff);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "threshold = " << threshold << tcu::TestLog::EndMessage;
		return tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, tcu::COMPARE_LOG_RESULT);
	}